

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O0

unsigned_short
Diligent::GetResourceArraySize<unsigned_short_const>(Compiler *Compiler,Resource *Res)

{
  undefined4 uVar1;
  bool bVar2;
  unsigned_short uVar3;
  SPIRType *pSVar4;
  size_t sVar5;
  Char *pCVar6;
  uint *puVar7;
  unsigned_short *Args_1;
  unsigned_short local_7a;
  undefined1 local_78 [8];
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  uint32_t arrSize;
  SPIRType *type;
  Resource *Res_local;
  Compiler *Compiler_local;
  
  msg.field_2._12_4_ = (Res->type_id).id;
  pSVar4 = diligent_spirv_cross::Compiler::get_type(Compiler,(TypeID)msg.field_2._12_4_);
  msg.field_2._8_4_ = 1;
  bVar2 = diligent_spirv_cross::VectorView<unsigned_int>::empty
                    (&(pSVar4->array).super_VectorView<unsigned_int>);
  if (!bVar2) {
    sVar5 = diligent_spirv_cross::VectorView<unsigned_int>::size
                      (&(pSVar4->array).super_VectorView<unsigned_int>);
    if (sVar5 != 1) {
      FormatString<char[52]>
                ((string *)local_48,
                 (char (*) [52])"Only one-dimensional arrays are currently supported");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"GetResourceArraySize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x32);
      std::__cxx11::string::~string((string *)local_48);
    }
    puVar7 = diligent_spirv_cross::VectorView<unsigned_int>::operator[]
                       (&(pSVar4->array).super_VectorView<unsigned_int>,0);
    msg.field_2._8_4_ = *puVar7;
  }
  uVar1 = msg.field_2._8_4_;
  uVar3 = std::numeric_limits<unsigned_short>::max();
  Args_1 = (unsigned_short *)(ulong)uVar3;
  if ((uint)uVar3 < (uint)uVar1) {
    local_7a = std::numeric_limits<unsigned_short>::max();
    FormatString<char[48],unsigned_short>
              ((string *)local_78,(Diligent *)"Array size exceeds maximum representable value ",
               (char (*) [48])&local_7a,Args_1);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"GetResourceArraySize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x35);
    std::__cxx11::string::~string((string *)local_78);
  }
  return (unsigned_short)msg.field_2._8_4_;
}

Assistant:

Type GetResourceArraySize(const diligent_spirv_cross::Compiler& Compiler,
                          const diligent_spirv_cross::Resource& Res)
{
    const auto& type    = Compiler.get_type(Res.type_id);
    uint32_t    arrSize = 1;
    if (!type.array.empty())
    {
        // https://github.com/KhronosGroup/SPIRV-Cross/wiki/Reflection-API-user-guide#querying-array-types
        VERIFY(type.array.size() == 1, "Only one-dimensional arrays are currently supported");
        arrSize = type.array[0];
    }
    VERIFY(arrSize <= std::numeric_limits<Type>::max(), "Array size exceeds maximum representable value ", std::numeric_limits<Type>::max());
    return static_cast<Type>(arrSize);
}